

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

int __thiscall
gl4cts::UncommittedRegionsAccessTestCase::init
          (UncommittedRegionsAccessTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  value_type_conflict1 local_18 [2];
  UncommittedRegionsAccessTestCase *local_10;
  UncommittedRegionsAccessTestCase *this_local;
  
  local_10 = this;
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  local_18[1] = 0x9100;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mSupportedTargets,local_18 + 1);
  local_18[0] = 0x9102;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mSupportedTargets,local_18);
  return extraout_EAX;
}

Assistant:

void UncommittedRegionsAccessTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}